

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O1

shared_ptr<int> __thiscall
Infector::AnyShared<BedRoomVS,_IRoomVS>::getReferenceCounter(AnyShared<BedRoomVS,_IRoomVS> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long *in_RDI;
  shared_ptr<int> sVar2;
  shared_ptr<int> sVar3;
  
  *in_RDI = (long)&this->a;
  p_Var1 = (this->ist).super___shared_ptr<BedRoomVS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  in_RDI[1] = (long)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
      return (shared_ptr<int>)sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<int>)sVar3.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<int> getReferenceCounter()override{
            return std::shared_ptr<int>(ist,&a);
        }